

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack3_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  
  auVar3 = vpbroadcastd_avx512vl();
  uVar1 = *(ulong *)(in + 1);
  uVar7 = (uint)uVar1;
  auVar8._4_4_ = uVar7;
  auVar8._0_4_ = uVar7;
  auVar8._8_4_ = uVar7;
  auVar8._12_4_ = uVar7;
  auVar8 = vpinsrd_avx(auVar8,*in,0);
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_0019fd00);
  auVar5 = valignd_avx512vl(ZEXT1632(auVar4),ZEXT1632(auVar4),7);
  auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar3),1);
  auVar6 = vpbroadcastd_avx512vl();
  auVar5 = vpblendd_avx2(auVar5,auVar6,0x20);
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_0019fd10);
  auVar6._0_8_ = auVar4._0_8_;
  auVar6._8_8_ = auVar6._0_8_;
  auVar6._16_8_ = auVar6._0_8_;
  auVar6._24_8_ = auVar6._0_8_;
  auVar5 = vpblendd_avx2(auVar5,auVar6,0xc0);
  auVar9._8_4_ = 7;
  auVar9._0_8_ = 0x700000007;
  auVar9._12_4_ = 7;
  auVar10._16_4_ = 7;
  auVar10._0_16_ = auVar9;
  auVar10._20_4_ = 7;
  auVar10._24_4_ = 7;
  auVar10._28_4_ = 7;
  auVar5 = vpand_avx2(auVar5,auVar10);
  *(undefined1 (*) [32])out = auVar5;
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_0019fd20);
  auVar4 = vpand_avx(auVar4,auVar9);
  *(long *)(out + 8) = auVar4._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4 = vpshufd_avx(auVar4,0x54);
  auVar2 = vpermq_avx2(ZEXT1632(auVar4),0x54);
  auVar3 = vpbroadcastd_avx512vl();
  auVar4 = vpshufd_avx(auVar8,0x54);
  auVar5 = vpermq_avx2(ZEXT1632(auVar4),0x54);
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_0019f0c0);
  auVar6 = vpor_avx2(auVar5,ZEXT432(uVar7 * 4 & 4));
  auVar5 = vpand_avx2(auVar5,auVar10);
  auVar5 = vpblendd_avx2(auVar5,auVar6,1);
  *(undefined1 (*) [32])(out + 10) = auVar5;
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_0019fd30);
  auVar4 = vpand_avx(auVar4,auVar9);
  *(long *)(out + 0x12) = auVar4._0_8_;
  out[0x14] = uVar7 >> 0x1c & 7;
  auVar5 = vpsrlvd_avx2(auVar2,_DAT_0019f0e0);
  uVar7 = (uint)(uVar1 >> 0x20);
  auVar6 = vpor_avx2(auVar5,ZEXT432(uVar7 * 2 & 6));
  auVar5 = vpand_avx2(auVar5,auVar10);
  auVar5 = vpblendd_avx2(auVar5,auVar6,1);
  *(undefined1 (*) [32])(out + 0x15) = auVar5;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_0019fd40);
  auVar4 = vpand_avx(auVar4,auVar9);
  *(long *)(out + 0x1d) = auVar4._0_8_;
  out[0x1f] = uVar7 >> 0x1d;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack3_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;
  *out = ((*in) >> 16) % (1U << 3);
  out++;
  *out = ((*in) >> 19) % (1U << 3);
  out++;
  *out = ((*in) >> 22) % (1U << 3);
  out++;
  *out = ((*in) >> 25) % (1U << 3);
  out++;
  *out = ((*in) >> 28) % (1U << 3);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 2)) << (3 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 3);
  out++;
  *out = ((*in) >> 5) % (1U << 3);
  out++;
  *out = ((*in) >> 8) % (1U << 3);
  out++;
  *out = ((*in) >> 11) % (1U << 3);
  out++;
  *out = ((*in) >> 14) % (1U << 3);
  out++;
  *out = ((*in) >> 17) % (1U << 3);
  out++;
  *out = ((*in) >> 20) % (1U << 3);
  out++;
  *out = ((*in) >> 23) % (1U << 3);
  out++;
  *out = ((*in) >> 26) % (1U << 3);
  out++;
  *out = ((*in) >> 29);
  ++in;
  out++;

  return in;
}